

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaExpandAttributeGroupRefs
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaBasicItemPtr item,
              xmlSchemaWildcardPtr *completeWild,xmlSchemaItemListPtr list,
              xmlSchemaItemListPtr prohibs)

{
  int *item_00;
  xmlSchemaPtr schema;
  xmlSchemaWildcardPtr source;
  xmlSchemaItemListPtr pxVar1;
  long *plVar2;
  void *pvVar3;
  int iVar4;
  xmlNodePtr pxVar5;
  xmlSchemaWildcardPtr pxVar6;
  xmlSchemaWildcardNsPtr pxVar7;
  xmlSchemaWildcardNsPtr pxVar8;
  void **ppvVar9;
  long lVar10;
  xmlChar *pxVar11;
  xmlSchemaWildcardNsPtr *ppxVar12;
  xmlSchemaWildcardNsPtr pxVar13;
  xmlSchemaItemListPtr pxVar14;
  xmlSchemaWildcardNsPtr pxVar15;
  xmlSchemaItemListPtr str2;
  long lVar16;
  xmlSchemaItemListPtr pxVar18;
  long lVar19;
  int idx;
  xmlSchemaAttributeGroupPtr_conflict attrGr;
  bool bVar20;
  xmlChar *str;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar21;
  xmlChar *local_50;
  xmlSchemaAttributeGroupPtr_conflict local_48;
  xmlSchemaBasicItemPtr local_40;
  xmlSchemaItemListPtr local_38;
  undefined7 uVar17;
  
  uVar21 = 0;
  pxVar6 = *completeWild;
  if (prohibs != (xmlSchemaItemListPtr)0x0) {
    prohibs->nbItems = 0;
  }
  iVar4 = list->nbItems;
  if (0 < iVar4) {
    uVar21 = (uint)(pxVar6 != (xmlSchemaWildcardPtr)0x0);
    idx = 0;
    str2 = prohibs;
    local_40 = item;
    do {
      lVar19 = (long)idx;
      item_00 = (int *)list->items[lVar19];
      if (*item_00 == 2000) {
        if (item_00[4] == 0x10) {
          attrGr = *(xmlSchemaAttributeGroupPtr_conflict *)(item_00 + 2);
          if (attrGr == (xmlSchemaAttributeGroupPtr_conflict)0x0) {
            return -1;
          }
          if (((attrGr->flags & 1) == 0) &&
             (iVar4 = xmlSchemaAttributeGroupExpandRefs(pctxt,attrGr), iVar4 == -1)) {
            return -1;
          }
          if (attrGr->attributeWildcard != (xmlSchemaWildcardPtr)0x0) {
            if (*completeWild == (xmlSchemaWildcardPtr)0x0) {
              *completeWild = attrGr->attributeWildcard;
            }
            else {
              bVar20 = uVar21 == 0;
              uVar21 = 1;
              if (bVar20) {
                schema = pctxt->schema;
                pxVar5 = xmlSchemaGetComponentNode(local_40);
                pxVar6 = xmlSchemaAddWildcard(pctxt,schema,XML_SCHEMA_TYPE_ANY_ATTRIBUTE,pxVar5);
                if ((pxVar6 == (xmlSchemaWildcardPtr)0x0) ||
                   (iVar4 = xmlSchemaCloneWildcardNsConstraints(pctxt,pxVar6,*completeWild),
                   iVar4 == -1)) {
                  uVar21 = 0;
                  bVar20 = false;
                }
                else {
                  pxVar6->processContents = (*completeWild)->processContents;
                  *completeWild = pxVar6;
                  bVar20 = true;
                  uVar21 = 1;
                }
                if (!bVar20) {
                  return -1;
                }
              }
              pxVar6 = *completeWild;
              source = attrGr->attributeWildcard;
              iVar4 = pxVar6->any;
              if (iVar4 == source->any) {
                pxVar7 = pxVar6->nsSet;
                uVar17 = (undefined7)((ulong)str2 >> 8);
                str2 = (xmlSchemaItemListPtr)CONCAT71(uVar17,pxVar7 == (xmlSchemaWildcardNsPtr)0x0);
                if ((pxVar7 == (xmlSchemaWildcardNsPtr)0x0) !=
                    (source->nsSet != (xmlSchemaWildcardNsPtr)0x0)) {
                  pxVar15 = pxVar6->negNsSet;
                  str2 = (xmlSchemaItemListPtr)
                         CONCAT71(uVar17,pxVar15 == (xmlSchemaWildcardNsPtr)0x0);
                  if (((pxVar15 == (xmlSchemaWildcardNsPtr)0x0) !=
                       (source->negNsSet != (xmlSchemaWildcardNsPtr)0x0)) &&
                     ((pxVar15 == (xmlSchemaWildcardNsPtr)0x0 ||
                      (str2 = (xmlSchemaItemListPtr)pxVar15->value,
                      str2 == (xmlSchemaItemListPtr)source->negNsSet->value)))) {
                    if (pxVar7 != (xmlSchemaWildcardNsPtr)0x0) {
                      pxVar15 = (xmlSchemaWildcardNsPtr)&source->nsSet;
                      do {
                        pxVar15 = pxVar15->next;
                        if (pxVar15 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001c593f;
                        str2 = (xmlSchemaItemListPtr)pxVar7->value;
                      } while ((str2 != (xmlSchemaItemListPtr)pxVar15->value) ||
                              (pxVar7 = pxVar7->next,
                              pxVar15 = (xmlSchemaWildcardNsPtr)&source->nsSet,
                              pxVar7 != (_xmlSchemaWildcardNs *)0x0));
                    }
                    goto LAB_001c5ac4;
                  }
                }
              }
LAB_001c593f:
              if ((iVar4 == 0) || (iVar4 == source->any)) {
                pxVar7 = pxVar6->negNsSet;
                if (((pxVar7 == (xmlSchemaWildcardNsPtr)0x0) ||
                    (source->nsSet == (xmlSchemaWildcardNsPtr)0x0)) &&
                   ((pxVar15 = source->negNsSet, pxVar15 == (xmlSchemaWildcardNsPtr)0x0 ||
                    (pxVar6->nsSet == (xmlSchemaWildcardNsPtr)0x0)))) {
                  str2 = (xmlSchemaItemListPtr)pxVar6->nsSet;
                  if ((str2 == (xmlSchemaItemListPtr)0x0) ||
                     (source->nsSet == (xmlSchemaWildcardNsPtr)0x0)) {
                    if (pxVar7 != (xmlSchemaWildcardNsPtr)0x0 &&
                        pxVar15 != (xmlSchemaWildcardNsPtr)0x0) {
                      str2 = (xmlSchemaItemListPtr)pxVar15->value;
                      if (((str2 == (xmlSchemaItemListPtr)0x0) ||
                          ((xmlSchemaItemListPtr)pxVar7->value == (xmlSchemaItemListPtr)0x0)) ||
                         ((xmlSchemaItemListPtr)pxVar7->value == str2)) {
                        if (((pxVar7 != (xmlSchemaWildcardNsPtr)0x0 &&
                              pxVar15 != (xmlSchemaWildcardNsPtr)0x0) &&
                            (pxVar7->value == (xmlChar *)0x0)) && (pxVar15->value != (xmlChar *)0x0)
                           ) {
                          pxVar7->value = pxVar15->value;
                        }
                      }
                      else {
                        str2 = (xmlSchemaItemListPtr)0x0;
                        xmlSchemaPErr(pctxt,pxVar6->node,0x701,
                                      "The intersection of the wildcard is not expressible.\n",
                                      (xmlChar *)0x0,(xmlChar *)0x0);
                      }
                    }
                  }
                  else {
                    ppxVar12 = &source->nsSet;
                    pxVar14 = (xmlSchemaItemListPtr)0x0;
                    local_48 = attrGr;
                    do {
                      bVar20 = pxVar14 == (xmlSchemaItemListPtr)0x0;
                      pxVar7 = (xmlSchemaWildcardNsPtr)ppxVar12;
                      pxVar18 = pxVar14;
                      pxVar14 = str2;
                      if (bVar20) {
                        pxVar18 = (xmlSchemaItemListPtr)&pxVar6->nsSet;
                      }
                      do {
                        while (pxVar7 = pxVar7->next, pxVar7 == (xmlSchemaWildcardNsPtr)0x0) {
                          pxVar18->items = (void **)pxVar14->items;
                          pxVar1 = (xmlSchemaItemListPtr)pxVar14->items;
                          local_38 = pxVar18;
                          (*xmlFree)(pxVar14);
                          pxVar7 = (xmlSchemaWildcardNsPtr)ppxVar12;
                          attrGr = local_48;
                          pxVar18 = local_38;
                          pxVar14 = pxVar1;
                          if (pxVar1 == (xmlSchemaItemListPtr)0x0) goto LAB_001c5ac4;
                        }
                      } while (*(xmlChar **)&pxVar14->nbItems != pxVar7->value);
                      str2 = (xmlSchemaItemListPtr)pxVar14->items;
                    } while (str2 != (xmlSchemaItemListPtr)0x0);
                  }
                }
                else {
                  if (pxVar6->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
                    pxVar11 = pxVar7->value;
                    iVar4 = xmlSchemaCloneWildcardNsConstraints(pctxt,pxVar6,source);
                    if (iVar4 == -1) {
                      return -1;
                    }
                  }
                  else {
                    pxVar11 = source->negNsSet->value;
                  }
                  pxVar13 = (xmlSchemaWildcardNsPtr)&pxVar6->nsSet;
                  pxVar15 = (xmlSchemaWildcardNsPtr)0x0;
                  pxVar7 = pxVar13;
                  do {
                    pxVar8 = pxVar15;
                    pxVar7 = pxVar7->next;
                    if (pxVar7 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001c5a85;
                    pxVar15 = pxVar7;
                  } while (pxVar7->value != (xmlChar *)0x0);
                  if (pxVar8 == (xmlSchemaWildcardNsPtr)0x0) {
                    pxVar8 = pxVar13;
                  }
                  pxVar8->next = pxVar7->next;
                  (*xmlFree)(pxVar7);
LAB_001c5a85:
                  if (pxVar11 != (xmlChar *)0x0) {
                    pxVar15 = (xmlSchemaWildcardNsPtr)0x0;
                    pxVar7 = pxVar13;
                    do {
                      pxVar8 = pxVar15;
                      pxVar7 = pxVar7->next;
                      if (pxVar7 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001c5ac4;
                      pxVar15 = pxVar7;
                    } while (pxVar7->value != pxVar11);
                    if (pxVar8 != (xmlSchemaWildcardNsPtr)0x0) {
                      pxVar13 = pxVar8;
                    }
                    pxVar13->next = pxVar7->next;
                    (*xmlFree)(pxVar7);
                  }
                }
              }
              else {
                iVar4 = xmlSchemaCloneWildcardNsConstraints(pctxt,pxVar6,source);
                if (iVar4 == -1) {
                  return -1;
                }
              }
            }
          }
LAB_001c5ac4:
          plVar2 = (long *)attrGr->attrUses;
          if ((plVar2 == (long *)0x0) || (lVar16 = plVar2[1], (int)lVar16 == 0)) {
            iVar4 = xmlSchemaItemListRemove(list,idx);
            if (iVar4 == -1) {
              return -1;
            }
            idx = idx + -1;
          }
          else {
            list->items[lVar19] = *(void **)*plVar2;
            if (((int)lVar16 != 1) && (1 < (int)plVar2[1])) {
              lVar16 = 1;
              do {
                pvVar3 = *(void **)(*plVar2 + lVar16 * 8);
                if (list->items == (void **)0x0) {
                  ppvVar9 = (void **)(*xmlMalloc)(0xa0);
                  list->items = ppvVar9;
                  if (ppvVar9 == (void **)0x0) {
                    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating new item list");
                    return -1;
                  }
                  list->sizeItems = 0x14;
                }
                else {
                  iVar4 = list->sizeItems;
                  if (iVar4 <= list->nbItems) {
                    list->sizeItems = iVar4 * 2;
                    ppvVar9 = (void **)(*xmlRealloc)(list->items,(long)iVar4 << 4);
                    list->items = ppvVar9;
                    if (ppvVar9 == (void **)0x0) {
                      __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"growing item list");
                      list->sizeItems = 0;
                      return -1;
                    }
                  }
                }
                lVar19 = lVar19 + 1;
                iVar4 = list->nbItems;
                lVar10 = (long)iVar4;
                if (lVar19 < lVar10) {
                  do {
                    list->items[lVar10] = list->items[lVar10 + -1];
                    lVar10 = lVar10 + -1;
                  } while (lVar19 < lVar10);
                  list->items[lVar19] = pvVar3;
                  list->nbItems = iVar4 + 1;
                }
                else {
                  list->nbItems = iVar4 + 1;
                  list->items[lVar10] = pvVar3;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < (int)plVar2[1]);
              idx = (int)lVar19;
            }
          }
        }
      }
      else if (*item_00 == 0x7d1) {
        if (prohibs == (xmlSchemaItemListPtr)0x0) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaExpandAttributeGroupRefs",
                     "unexpected attr prohibition found",(xmlChar *)0x0,(xmlChar *)str2);
          return -1;
        }
        iVar4 = xmlSchemaItemListRemove(list,idx);
        if (iVar4 == -1) {
          return -1;
        }
        idx = idx + -1;
        xmlSchemaItemListAddSize(prohibs,2,item_00);
      }
      idx = idx + 1;
      iVar4 = list->nbItems;
    } while (idx < iVar4);
  }
  if ((prohibs != (xmlSchemaItemListPtr)0x0) &&
     (lVar19 = (long)prohibs->nbItems, iVar4 != 0 && 0 < lVar19)) {
    do {
      if (0 < (long)list->nbItems) {
        pvVar3 = prohibs->items[lVar19 + -1];
        lVar16 = 0;
        do {
          lVar10 = *(long *)((long)list->items[lVar16] + 0x18);
          if ((*(xmlChar **)((long)pvVar3 + 0x10) == *(xmlChar **)(lVar10 + 0x10)) &&
             (*(xmlChar **)((long)pvVar3 + 0x18) == *(xmlChar **)(lVar10 + 0x70))) {
            local_50 = (xmlChar *)0x0;
            pxVar5 = *(xmlNodePtr *)((long)pvVar3 + 8);
            pxVar11 = xmlSchemaFormatQName
                                (&local_50,*(xmlChar **)((long)pvVar3 + 0x18),
                                 *(xmlChar **)((long)pvVar3 + 0x10));
            xmlSchemaCustomWarning
                      ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,pxVar5,
                       (xmlSchemaTypePtr)
                       "Skipping pointless attribute use prohibition \'%s\', since a corresponding attribute use exists already in the type definition"
                       ,(char *)pxVar11,(xmlChar *)0x0,(xmlChar *)0x0,
                       (xmlChar *)CONCAT44(uVar21,in_stack_ffffffffffffff90));
            if (local_50 != (xmlChar *)0x0) {
              (*xmlFree)(local_50);
              local_50 = (xmlChar *)0x0;
            }
            iVar4 = xmlSchemaItemListRemove(prohibs,(int)(lVar19 + -1));
            if (iVar4 == -1) {
              return -1;
            }
            break;
          }
          lVar16 = lVar16 + 1;
        } while (list->nbItems != lVar16);
      }
      bVar20 = 1 < lVar19;
      lVar19 = lVar19 + -1;
    } while (bVar20);
  }
  return 0;
}

Assistant:

static int
xmlSchemaExpandAttributeGroupRefs(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaBasicItemPtr item,
				  xmlSchemaWildcardPtr *completeWild,
				  xmlSchemaItemListPtr list,
				  xmlSchemaItemListPtr prohibs)
{
    xmlSchemaAttributeGroupPtr gr;
    xmlSchemaAttributeUsePtr use;
    xmlSchemaItemListPtr sublist;
    int i, j;
    int created = (*completeWild == NULL) ? 0 : 1;

    if (prohibs)
	prohibs->nbItems = 0;

    for (i = 0; i < list->nbItems; i++) {
	use = list->items[i];

	if (use->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
	    if (prohibs == NULL) {
		PERROR_INT("xmlSchemaExpandAttributeGroupRefs",
		    "unexpected attr prohibition found");
		return(-1);
	    }
	    /*
	    * Remove from attribute uses.
	    */
	    if (xmlSchemaItemListRemove(list, i) == -1)
		return(-1);
	    i--;
	    /*
	    * Note that duplicate prohibitions were already
	    * handled at parsing time.
	    */
	    /*
	    * Add to list of prohibitions.
	    */
	    xmlSchemaItemListAddSize(prohibs, 2, use);
	    continue;
	}
	if ((use->type == XML_SCHEMA_EXTRA_QNAMEREF) &&
	    ((WXS_QNAME_CAST use)->itemType == XML_SCHEMA_TYPE_ATTRIBUTEGROUP))
	{
	    if ((WXS_QNAME_CAST use)->item == NULL)
		return(-1);
	    gr = WXS_ATTR_GROUP_CAST (WXS_QNAME_CAST use)->item;
	    /*
	    * Expand the referenced attr. group.
	    * TODO: remove this, this is done in a previous step, so
	    * already done here.
	    */
	    if ((gr->flags & XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED) == 0) {
		if (xmlSchemaAttributeGroupExpandRefs(pctxt, gr) == -1)
		    return(-1);
	    }
	    /*
	    * Build the 'complete' wildcard; i.e. intersect multiple
	    * wildcards.
	    */
	    if (gr->attributeWildcard != NULL) {
		if (*completeWild == NULL) {
		    *completeWild = gr->attributeWildcard;
		} else {
		    if (! created) {
			xmlSchemaWildcardPtr tmpWild;

			 /*
			* Copy the first encountered wildcard as context,
			* except for the annotation.
			*
			* Although the complete wildcard might not correspond
			* to any node in the schema, we will anchor it on
			* the node of the owner component.
			*/
			tmpWild =  xmlSchemaAddWildcard(pctxt, pctxt->schema,
			    XML_SCHEMA_TYPE_ANY_ATTRIBUTE,
			    WXS_ITEM_NODE(item));
			if (tmpWild == NULL)
			    return(-1);
			if (xmlSchemaCloneWildcardNsConstraints(pctxt,
			    tmpWild, *completeWild) == -1)
			    return (-1);
			tmpWild->processContents = (*completeWild)->processContents;
			*completeWild = tmpWild;
			created = 1;
		    }

		    if (xmlSchemaIntersectWildcards(pctxt, *completeWild,
			gr->attributeWildcard) == -1)
			return(-1);
		}
	    }
	    /*
	    * Just remove the reference if the referenced group does not
	    * contain any attribute uses.
	    */
	    sublist = ((xmlSchemaItemListPtr) gr->attrUses);
	    if ((sublist == NULL) || sublist->nbItems == 0) {
		if (xmlSchemaItemListRemove(list, i) == -1)
		    return(-1);
		i--;
		continue;
	    }
	    /*
	    * Add the attribute uses.
	    */
	    list->items[i] = sublist->items[0];
	    if (sublist->nbItems != 1) {
		for (j = 1; j < sublist->nbItems; j++) {
		    i++;
		    if (xmlSchemaItemListInsert(list,
			    sublist->items[j], i) == -1)
			return(-1);
		}
	    }
	}

    }
    /*
    * Handle pointless prohibitions of declared attributes.
    */
    if (prohibs && (prohibs->nbItems != 0) && (list->nbItems != 0)) {
	xmlSchemaAttributeUseProhibPtr prohib;

	for (i = prohibs->nbItems -1; i >= 0; i--) {
	    prohib = prohibs->items[i];
	    for (j = 0; j < list->nbItems; j++) {
		use = list->items[j];

		if ((prohib->name == WXS_ATTRUSE_DECL_NAME(use)) &&
		    (prohib->targetNamespace == WXS_ATTRUSE_DECL_TNS(use)))
		{
		    xmlChar *str = NULL;

		    xmlSchemaCustomWarning(ACTXT_CAST pctxt,
			XML_SCHEMAP_WARN_ATTR_POINTLESS_PROH,
			prohib->node, NULL,
			"Skipping pointless attribute use prohibition "
			"'%s', since a corresponding attribute use "
			"exists already in the type definition",
			xmlSchemaFormatQName(&str,
			    prohib->targetNamespace, prohib->name),
			NULL, NULL);
		    FREE_AND_NULL(str);
		    /*
		    * Remove the prohibition.
		    */
		    if (xmlSchemaItemListRemove(prohibs, i) == -1)
			return(-1);
		    break;
		}
	    }
	}
    }
    return(0);
}